

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uStack_40;
  int res;
  double val;
  mpt_value *src_1;
  mpt_iterator *it;
  mpt_metatype *src;
  char **ppcStack_18;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  src._4_4_ = 1;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  do {
    if ((int)argv_local <= src._4_4_) {
      return 0;
    }
    it = (mpt_iterator *)mpt_iterator_create(ppcStack_18[src._4_4_]);
    if (it == (mpt_iterator *)0x0) {
      fputs("bad format <",_stderr);
      fputs(ppcStack_18[src._4_4_],_stderr);
      fputc(0x3e,_stderr);
      fputc(10,_stderr);
    }
    else {
      (*it->_vptr->value)(it);
      do {
        val = (double)(**src_1->_addr)(src_1);
        if (val == 0.0) {
          fprintf(_stderr,"%s\n","value query error");
          break;
        }
        iVar1 = mpt_value_convert(val,100,&stack0xffffffffffffffc0);
        if (iVar1 < 0) {
          fprintf(_stderr,"%s: %d\n","conversion error",(ulong)(uint)-iVar1);
          break;
        }
        fprintf(_stdout,"%g ",uStack_40);
        iVar1 = (**(code **)((long)src_1->_addr + 8))(src_1);
        if (iVar1 < 0) {
          fprintf(_stderr,"%s: %d\n","advance error",(ulong)(uint)-iVar1);
          break;
        }
      } while (iVar1 != 0);
      (*it->_vptr->advance)(it);
      fputc(10,_stdout);
    }
    src._4_4_ = src._4_4_ + 1;
  } while( true );
}

Assistant:

extern int main(int argc, char *argv[])
{
	int i;
	
	for (i = 1; i < argc; ++i) {
		MPT_INTERFACE(metatype) *src;
		MPT_INTERFACE(iterator) *it;
		if (!(src = mpt_iterator_create(argv[i]))) {
			fputs("bad format <", stderr);
			fputs(argv[i], stderr);
			fputc('>', stderr);
			fputc('\n', stderr);
			continue;
		}
		MPT_metatype_convert(src, MPT_ENUM(TypeIteratorPtr), &it);
		while (1) {
			const MPT_STRUCT(value) *src;
			double val;
			int res;
			if (!(src = it->_vptr->value(it))) {
				fprintf(stderr, "%s\n", "value query error");
				break;
			}
			if ((res = mpt_value_convert(src, 'd', &val)) < 0) {
				fprintf(stderr, "%s: %d\n", "conversion error", -res);
				break;
			}
			fprintf(stdout, "%g ", val);
			
			if ((res = it->_vptr->advance(it)) < 0) {
				fprintf(stderr, "%s: %d\n", "advance error", -res);
				break;
			}
			if (!res) {
				break;
			}
		}
		src->_vptr->unref(src);
		fputc('\n', stdout);
	}
	return 0;
}